

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strings.c
# Opt level: O1

void sbs_substr(sbstring *sbs,ptrdiff_t pos,size_t len)

{
  char *__src;
  char *__dest;
  ulong __n;
  
  __dest = sbs->begin;
  if ((long)sbs->end - (long)__dest < pos) {
    sbs->end = __dest;
  }
  if (-1 < pos) {
    __src = __dest + pos;
    __n = (long)sbs->end - (long)__src;
    if (len <= __n) {
      __n = len;
    }
    if (__n == pos) {
      memcpy(__dest,__src,__n);
    }
    else {
      memmove(__dest,__src,__n);
    }
    sbs->end = sbs->begin + __n;
    sbs->begin[__n] = '\0';
  }
  return;
}

Assistant:

void sbs_substr(sbstring *sbs, ptrdiff_t pos, size_t len)
{
    if (pos > sbs->end - sbs->begin) {
        /* starting past end of string, do nothing */
        sbs->end = sbs->begin;
    }
    if (pos >= 0) {
        size_t sz = sbs->end - (sbs->begin + pos);
        if (len > sz) len = sz;
        if (len - pos > 0) {
            memmove(sbs->begin, sbs->begin + pos, len);
        }
        else {
            memcpy(sbs->begin, sbs->begin + pos, len);
        }
        sbs->end = sbs->begin + len;
        sbs->end[0] = '\0';
    }
}